

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O2

void * uo_cb_manage_thrds(void *arg)

{
  UO_CB_THRD_STATE UVar1;
  atomic_size_t aVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  void *__arg;
  atomic_size_t aVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  long local_60;
  timespec abs_timeout;
  
  thrdpool.thrd_count_target = 4;
  dVar9 = 500.0;
  __arg = (void *)0x0;
  local_60 = 100;
  aVar6 = thrdpool.thrd_count;
  do {
    if (is_quitting != 0) {
      return (void *)0x0;
    }
    bVar3 = 0;
LAB_00107a66:
    aVar2 = thrdpool.thrd_count;
    if ((((bVar3 & 1) == 0) && (aVar6 < 0x10)) && (aVar6 < thrdpool.thrd_count_target)) {
      LOCK();
      thrdpool.thrd_count = thrdpool.thrd_count + 1;
      UNLOCK();
      do {
        UVar1 = thrdpool.cb_thrds[(long)__arg].state;
        if (UVar1 == UO_CB_THRD_EXITED) {
          pthread_join(thrdpool.cb_thrds[(long)__arg].thrd,(void **)0x0);
          thrdpool.cb_thrds[(long)__arg].state = UO_CB_THRD_UNINITIALIZED;
        }
        else if (UVar1 == UO_CB_THRD_UNINITIALIZED) goto LAB_00107aba;
        __arg = (void *)(ulong)((int)__arg + 1U & 0xf);
      } while( true );
    }
    clock_gettime(0,(timespec *)&abs_timeout);
    dVar8 = fmod(dVar9 * 1000000.0,1000000000.0);
    lVar5 = (long)((double)abs_timeout.tv_nsec + dVar8);
    abs_timeout.tv_nsec = lVar5 + -1000000000;
    if (lVar5 < 1000000000) {
      abs_timeout.tv_nsec = lVar5;
    }
    abs_timeout.tv_sec = (long)(dVar9 / 1000.0) + abs_timeout.tv_sec + (ulong)(999999999 < lVar5);
    iVar4 = sem_timedwait((sem_t *)&thrdpool.update_sem,(timespec *)&abs_timeout);
    aVar2 = thrdpool.sample.completions;
    if (iVar4 != 0) {
      if (thrdpool.executing_count == 0) {
        local_60 = local_60 + -1;
        if (local_60 == 0) {
          if (thrdpool.thrd_count_target < 3) {
            sem_wait((sem_t *)&thrdpool.update_sem);
          }
          else {
            thrdpool.thrd_count_target = thrdpool.thrd_count_target - 1;
            dVar9 = dVar9 * 1.5;
          }
          local_60 = 100;
        }
        LOCK();
        thrdpool.sample.completions = 0;
        UNLOCK();
      }
      else {
        LOCK();
        thrdpool.sample.completions = 0;
        UNLOCK();
        uVar7 = (long)(thrdpool.sample.weighted_throughput - 9.223372036854776e+18) &
                (long)thrdpool.sample.weighted_throughput >> 0x3f |
                (long)thrdpool.sample.weighted_throughput;
        auVar10._8_4_ = (int)(aVar2 >> 0x20);
        auVar10._0_8_ = aVar2;
        auVar10._12_4_ = 0x45300000;
        auVar11._8_4_ = (int)(thrdpool.thrd_count_target >> 0x20);
        auVar11._0_8_ = thrdpool.thrd_count_target;
        auVar11._12_4_ = 0x45300000;
        dVar8 = pow(0.95,(auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)thrdpool.thrd_count_target) -
                         4503599627370496.0));
        thrdpool.sample.weighted_throughput =
             dVar8 * (((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)aVar2) - 4503599627370496.0)) / dVar9);
        auVar13._8_4_ = (int)(uVar7 >> 0x20);
        auVar13._0_8_ = uVar7;
        auVar13._12_4_ = 0x45300000;
        dVar8 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
        thrdpool.sample.thrd_target_increase =
             thrdpool.sample.thrd_target_increase == dVar8 < thrdpool.sample.weighted_throughput;
        if (thrdpool.sample.thrd_target_increase) {
          dVar12 = 1.5;
          lVar5 = 1;
          if (thrdpool.thrd_count_target < 0x10) {
LAB_00107caf:
            thrdpool.thrd_count_target = thrdpool.thrd_count_target + lVar5;
            dVar12 = *(double *)
                      (&DAT_0010a080 + (ulong)(dVar8 < thrdpool.sample.weighted_throughput) * 8);
          }
        }
        else {
          lVar5 = -1;
          dVar12 = 1.5;
          if (2 < thrdpool.thrd_count_target) goto LAB_00107caf;
        }
        dVar9 = dVar9 * dVar12;
      }
      dVar8 = 10.0;
      if (10.0 <= dVar9) {
        dVar8 = dVar9;
      }
      dVar9 = (double)(-(ulong)(5000.0 < dVar9) & 0x40b3880000000000 |
                      ~-(ulong)(5000.0 < dVar9) & (ulong)dVar8);
    }
  } while( true );
LAB_00107aba:
  aVar6 = aVar2 + 1;
  thrdpool.cb_thrds[(long)__arg].state = UO_CB_THRD_RUNNING;
  pthread_create(&thrdpool.cb_thrds[(long)__arg].thrd,(pthread_attr_t *)0x0,uo_cb_execute,__arg);
  bVar3 = is_quitting;
  goto LAB_00107a66;
}

Assistant:

static void *uo_cb_manage_thrds(
    void *arg)
{
    thrdpool.thrd_count_target = UO_CB_THRD_COUNT_INI;

    size_t thrd_i = 0;
    size_t count = thrdpool.thrd_count;

    double duration_msec = UO_CB_THRDPOOL_TIMEO_INI;
    size_t pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;

    while (!is_quitting)
    {
        while (!is_quitting && count < thrdpool.thrd_count_target && count < UO_CB_THRD_COUNT_MAX)
        {
            count = atomic_fetch_add(&thrdpool.thrd_count, 1) + 1;

            enum UO_CB_THRD_STATE thrd_state;

            while (thrd_state = thrdpool.cb_thrds[thrd_i].state)
            {
                if (thrd_state == UO_CB_THRD_EXITED)
                {
                    pthread_join(thrdpool.cb_thrds[thrd_i].thrd, NULL);
                    thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_UNINITIALIZED;
                }

                ++thrd_i;
                thrd_i %= UO_CB_THRD_COUNT_MAX;
            }

            thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_RUNNING;
            
            pthread_create(&thrdpool.cb_thrds[thrd_i].thrd, 0, uo_cb_execute, (void *)(uintptr_t)thrd_i);
        }

        struct timespec abs_timeout;
        clock_gettime(CLOCK_REALTIME, &abs_timeout);
        timespec_add_ms(&abs_timeout, duration_msec);

        if (sem_timedwait(&thrdpool.update_sem, &abs_timeout) != 0)
        {
            if (atomic_load(&thrdpool.executing_count))
            {
                size_t completions = atomic_exchange(&thrdpool.sample.completions, 0);

                size_t prev_weighted_throughput = thrdpool.sample.weighted_throughput;
                thrdpool.sample.weighted_throughput = completions / duration_msec * pow(1.0 - UO_CB_THRDPOOL_COST_PER_THRD, thrdpool.thrd_count_target);

                bool was_correct = thrdpool.sample.weighted_throughput > prev_weighted_throughput;
                thrdpool.sample.thrd_target_increase = !(was_correct ^ thrdpool.sample.thrd_target_increase);
                
                if (thrdpool.sample.thrd_target_increase)
                {
                    if (thrdpool.thrd_count_target < UO_CB_THRD_COUNT_MAX)
                    {
                        ++thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
                else
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
            }
            else
            {
                if (--pause_counter == 0)
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        sem_wait(&thrdpool.update_sem);

                    pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;
                }
                
                atomic_store(&thrdpool.sample.completions, 0);
            }

            duration_msec = duration_msec > UO_CB_THRDPOOL_TIMEO_MAX
                ? UO_CB_THRDPOOL_TIMEO_MAX
                : duration_msec < UO_CB_THRDPOOL_TIMEO_MIN
                    ? UO_CB_THRDPOOL_TIMEO_MIN
                    : duration_msec;
        }
    }

    return NULL;
}